

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

size_t __thiscall QPDFWriter::calculateXrefStreamPadding(QPDFWriter *this,qpdf_offset_t xref_bytes)

{
  long lVar1;
  type ii;
  size_t i;
  
  lVar1 = xref_bytes + 0x7ffe;
  if (-1 < xref_bytes + 0x3fff) {
    lVar1 = xref_bytes + 0x3fff;
  }
  i = (lVar1 >> 0xe) * 5 + 0x10;
  if (xref_bytes < -0x13ffe) {
    QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(i);
  }
  return i;
}

Assistant:

size_t
QPDFWriter::calculateXrefStreamPadding(qpdf_offset_t xref_bytes)
{
    // This routine is called right after a linearization first pass xref stream has been written
    // without compression.  Calculate the amount of padding that would be required in the worst
    // case, assuming the number of uncompressed bytes remains the same. The worst case for zlib is
    // that the output is larger than the input by 6 bytes plus 5 bytes per 16K, and then we'll add
    // 10 extra bytes for number length increases.

    return QIntC::to_size(16 + (5 * ((xref_bytes + 16383) / 16384)));
}